

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O1

void __thiscall QTuioHandler::QTuioHandler(QTuioHandler *this,QString *specification)

{
  QUdpSocket *this_00;
  QTuioHandler *this_01;
  long lVar1;
  int *piVar2;
  QDebug QVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined8 *puVar9;
  QTransform *pQVar10;
  QPointingDevice *pQVar11;
  undefined4 *puVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  CaseSensitivity CVar16;
  undefined8 *puVar17;
  ImplFn p_Var18;
  QTuioHandler *pQVar19;
  ulong uVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  byte bVar22;
  QByteArrayView QVar23;
  QStringView QVar24;
  QByteArrayView QVar25;
  QStringView QVar26;
  QByteArrayView QVar27;
  QStringView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  ulong local_128;
  QObject local_f8 [8];
  QDebug local_f0;
  QDebug local_e8;
  storage_type_conflict *psStack_e0;
  qsizetype local_d8;
  QArrayDataPointer<QString> local_c8;
  QString local_a8;
  QString local_88;
  char *local_70;
  long local_38;
  
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00115858;
  *(undefined8 *)(this + 0x10) = 0;
  this_00 = (QUdpSocket *)(this + 0x18);
  QUdpSocket::QUdpSocket(this_00,(QObject *)0x0);
  this_01 = this + 0x68;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  puVar17 = &DAT_001114e8;
  pQVar19 = this_01;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    *(undefined8 *)pQVar19 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
    pQVar19 = pQVar19 + (ulong)bVar22 * -0x10 + 8;
  }
  *(ushort *)(this + 0xb0) = *(ushort *)(this + 0xb0) & 0xfc00;
  local_c8.size = 0xaaaaaaaaaaaaaaaa;
  local_c8.d._0_4_ = 0xaaaaaaaa;
  local_c8.d._4_4_ = 0xaaaaaaaa;
  local_c8.ptr._0_4_ = 0xaaaaaaaa;
  local_c8.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_c8,specification,0x3a,0,1);
  if (local_c8.size == 0) {
    local_128._0_4_ = 0;
    uVar20 = 0xd05;
    bVar7 = false;
    bVar6 = false;
  }
  else {
    uVar20 = 0xd05;
    lVar14 = 0;
    uVar21 = 0;
    local_128 = 0;
    bVar6 = false;
    bVar7 = false;
    do {
      lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
      QVar23.m_data = (storage_type *)0x4;
      QVar23.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar23);
      local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
      local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
      CVar16 = (CaseSensitivity)&local_a8;
      cVar4 = QString::startsWith((QString *)(lVar1 + lVar14),CVar16);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar4 == '\0') {
        lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        QVar25.m_data = (storage_type *)0x4;
        QVar25.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar25);
        local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
        local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
        local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
        cVar4 = QString::startsWith((QString *)(lVar1 + lVar14),CVar16);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (cVar4 == '\0') {
          bVar5 = comparesEqual((QString *)
                                (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) + lVar14),"invertx"
                               );
          if (bVar5) {
            bVar6 = true;
          }
          else {
            bVar5 = comparesEqual((QString *)
                                  (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) + lVar14),
                                  "inverty");
            if (bVar5) {
              bVar7 = true;
            }
            else {
              lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
              QVar27.m_data = (storage_type *)0x7;
              QVar27.m_size = (qsizetype)&local_88;
              QString::fromUtf8(QVar27);
              local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
              local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
              local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
              cVar4 = QString::startsWith((QString *)(lVar1 + lVar14),CVar16);
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (cVar4 != '\0') {
                local_a8.d.size = -0x5555555555555556;
                local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
                QString::QString(&local_88,(QChar)0x3d);
                QString::section(&local_a8,lVar1 + lVar14,&local_88,1,1,0);
                piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10)
                    ;
                  }
                }
                QVar28.m_data = local_a8.d.ptr;
                QVar28.m_size = local_a8.d.size;
                uVar8 = QString::toIntegral_helper(QVar28,(bool *)0x0,10);
                uVar15 = uVar8 & 0xffffffff;
                if ((long)(int)uVar8 != uVar8) {
                  uVar15 = 0;
                }
                iVar13 = (int)uVar15;
                if (((iVar13 == 0x5a) || (iVar13 == 0x10e)) || (iVar13 == 0xb4)) {
                  local_128 = uVar15;
                }
                goto LAB_00108a81;
              }
            }
          }
        }
        else {
          local_d8 = -0x5555555555555556;
          local_e8.stream = (Stream *)0xaaaaaaaaaaaaaaaa;
          psStack_e0 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
          lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
          QString::QString(&local_88,(QChar)0x3d);
          QString::section(&local_e8,lVar1 + lVar14,&local_88,1,1,0);
          piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
            }
          }
          QVar26.m_data = psStack_e0;
          QVar26.m_size = local_d8;
          uVar8 = QString::toIntegral_helper(QVar26,(bool *)0x0,10);
          uVar20 = uVar8 & 0xffffffff;
          if ((long)(int)uVar8 != uVar8) {
            uVar20 = 0;
          }
          lcTuioHandler();
          if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
              != 0) {
            local_88.d.d._0_4_ = 2;
            local_88.d.d._4_4_ = 0;
            local_88.d.ptr._0_4_ = 0;
            local_88.d.ptr._4_4_ = 0;
            local_88.d.size._0_4_ = 0;
            local_88.d.size._4_4_ = 0;
            local_70 = lcTuioHandler::category.name;
            QMessageLogger::warning();
            QVar3.stream = local_f0.stream;
            QVar29.m_data = (storage_type *)0x31;
            QVar29.m_size = (qsizetype)&local_a8;
            QString::fromUtf8(QVar29);
            QTextStream::operator<<((QTextStream *)QVar3.stream,&local_a8);
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (*(QTextStream *)(local_f0.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_f0.stream,' ');
            }
            QTextStream::operator<<((QTextStream *)local_f0.stream,(int)uVar20);
            if (*(QTextStream *)(local_f0.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_f0.stream,' ');
            }
            QDebug::~QDebug(&local_f0);
          }
          if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
            iVar13 = *(int *)local_e8.stream;
            UNLOCK();
            QVar3.stream = local_e8.stream;
            goto joined_r0x00108be9;
          }
        }
      }
      else {
        local_a8.d.size = -0x5555555555555556;
        local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        lVar1 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        QString::QString(&local_88,(QChar)0x3d);
        QString::section(&local_a8,lVar1 + lVar14,&local_88,1,1,0);
        piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
          }
        }
        QVar24.m_data = local_a8.d.ptr;
        QVar24.m_size = local_a8.d.size;
        uVar8 = QString::toIntegral_helper(QVar24,(bool *)0x0,10);
        uVar20 = uVar8 & 0xffffffff;
        if ((long)(int)uVar8 != uVar8) {
          uVar20 = 0;
        }
LAB_00108a81:
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar13 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          QVar3.stream = (Stream *)local_a8.d.d;
joined_r0x00108be9:
          if (iVar13 == 0) {
            QArrayData::deallocate((QArrayData *)QVar3.stream,2,0x10);
          }
        }
      }
      uVar21 = uVar21 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar21 < (ulong)local_c8.size);
  }
  if ((int)local_128 != 0) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::rotate((double)(int)local_128,(Axis)&local_88);
    puVar9 = (undefined8 *)QTransform::translate(-0.5,-0.5);
    puVar17 = puVar9;
    pQVar19 = this_01;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *(undefined8 *)pQVar19 = *puVar17;
      puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      pQVar19 = pQVar19 + (ulong)bVar22 * -0x10 + 8;
    }
    *(undefined2 *)(this + 0xb0) = *(undefined2 *)(puVar9 + 9);
  }
  if (bVar6) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::scale(-1.0,1.0);
    pQVar10 = (QTransform *)QTransform::translate(-0.5,-0.5);
    QTransform::operator*=((QTransform *)this_01,pQVar10);
  }
  if (bVar7) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::scale(1.0,-1.0);
    pQVar10 = (QTransform *)QTransform::translate(-0.5,-0.5);
    QTransform::operator*=((QTransform *)this_01,pQVar10);
  }
  pQVar11 = (QPointingDevice *)operator_new(0x10);
  QVar30.m_data = (storage_type *)0x4;
  QVar30.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar30);
  local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
  local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
  local_88.d.size._0_4_ = 0;
  local_88.d.size._4_4_ = 0;
  local_88.d.d._0_4_ = 0;
  local_88.d.d._4_4_ = 0;
  local_88.d.ptr._0_4_ = 0;
  local_88.d.ptr._4_4_ = 0;
  QPointingDevice::QPointingDevice
            (pQVar11,&local_a8,1,2,2,0x2b,0x10,0,&local_88,0xffffffffffffffff,0);
  *(QPointingDevice **)(this + 0x10) = pQVar11;
  piVar2 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWindowSystemInterface::registerInputDevice(*(QInputDevice **)(this + 0x10));
  QHostAddress::QHostAddress((QHostAddress *)&local_88,Any);
  cVar4 = (**(code **)(*(long *)(this + 0x18) + 0xf0))
                    (this_00,(QHostAddress *)&local_88,uVar20 & 0xffff,0);
  QHostAddress::~QHostAddress((QHostAddress *)&local_88);
  if (cVar4 == '\0') {
    lcTuioHandler();
    if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
    {
      local_88.d.d._0_4_ = 2;
      local_88.d.d._4_4_ = 0;
      local_88.d.ptr._0_4_ = 0;
      local_88.d.ptr._4_4_ = 0;
      local_88.d.size._0_4_ = 0;
      local_88.d.size._4_4_ = 0;
      local_70 = lcTuioHandler::category.name;
      QMessageLogger::warning();
      QVar3.stream = local_e8.stream;
      QVar31.m_data = (storage_type *)0x1c;
      QVar31.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar31);
      QTextStream::operator<<((QTextStream *)QVar3.stream,&local_a8);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QIODevice::errorString();
      p_Var18 = (ImplFn)local_a8.d.ptr;
      if ((ImplFn)local_a8.d.ptr == (ImplFn)0x0) {
        p_Var18 = (ImplFn)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_e8,(ulong)p_Var18);
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug(&local_e8);
    }
  }
  else {
    local_a8.d.d = (Data *)processPackets;
    local_a8.d.ptr = (char16_t *)0x0;
    local_88.d.d._0_4_ = 0x1171b8;
    local_88.d.d._4_4_ = 0;
    local_88.d.ptr._0_4_ = 0;
    local_88.d.ptr._4_4_ = 0;
    puVar12 = (undefined4 *)operator_new(0x20);
    *puVar12 = 1;
    *(code **)(puVar12 + 2) =
         QtPrivate::QCallableObject<void_(QTuioHandler::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar12 + 4) = processPackets;
    *(undefined8 *)(puVar12 + 6) = 0;
    QObject::connectImpl
              (local_f8,(void **)this_00,(QObject *)&local_88,(void **)this,
               (QSlotObjectBase *)&local_a8,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_f8);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTuioHandler::QTuioHandler(const QString &specification)
{
    QStringList args = specification.split(':');
    int portNumber = 3333;
    int rotationAngle = 0;
    bool invertx = false;
    bool inverty = false;

    for (int i = 0; i < args.size(); ++i) {
        if (args.at(i).startsWith("udp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
        } else if (args.at(i).startsWith("tcp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
            qCWarning(lcTuioHandler) << "TCP is not yet supported. Falling back to UDP on " << portNumber;
        } else if (args.at(i) == "invertx") {
            invertx = true;
        } else if (args.at(i) == "inverty") {
            inverty = true;
        } else if (args.at(i).startsWith("rotate=")) {
            QString rotateArg = args.at(i).section('=', 1, 1);
            int argValue = rotateArg.toInt();
            switch (argValue) {
            case 90:
            case 180:
            case 270:
                rotationAngle = argValue;
                break;
            default:
                break;
            }
        }
    }

    if (rotationAngle)
        m_transform = QTransform::fromTranslate(0.5, 0.5).rotate(rotationAngle).translate(-0.5, -0.5);

    if (invertx)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(-1.0, 1.0).translate(-0.5, -0.5);

    if (inverty)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(1.0, -1.0).translate(-0.5, -0.5);

    // not leaked, QPointingDevice cleans up registered devices itself
    // TODO register each device based on SOURCE, not just an all-purpose generic touchscreen
    // TODO define seats when multiple connections occur
    m_device = new QPointingDevice(QLatin1String("TUIO"), 1, QInputDevice::DeviceType::TouchScreen,
                                   QPointingDevice::PointerType::Finger,
                                   QInputDevice::Capability::Position |
                                   QInputDevice::Capability::Area |
                                   QInputDevice::Capability::Velocity |
                                   QInputDevice::Capability::NormalizedPosition,
                                   16, 0);
    QWindowSystemInterface::registerInputDevice(m_device);

    if (!m_socket.bind(QHostAddress::Any, portNumber)) {
        qCWarning(lcTuioHandler) << "Failed to bind TUIO socket: " << m_socket.errorString();
        return;
    }

    connect(&m_socket, &QUdpSocket::readyRead, this, &QTuioHandler::processPackets);
}